

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WasmByteCodeGenerator.cpp
# Opt level: O1

EmitInfo __thiscall
Wasm::WasmBytecodeGenerator::EmitSimdMemAccess
          (WasmBytecodeGenerator *this,OpCodeAsmJs op,WasmType *signature,ViewType viewType,
          uint8 dataWidth,bool isStore)

{
  WasmType type;
  uint32 uVar1;
  EmitInfoBase EVar2;
  WasmBinaryReader *pWVar3;
  WasmRegisterSpace *this_00;
  WasmCompilationException *this_01;
  WasmBinaryReader *pWVar4;
  EmitInfo EVar5;
  EmitInfo local_50;
  EmitInfo rhsInfo;
  EmitInfo exprInfo;
  
  type = *signature;
  SetUsesMemory(this,0);
  pWVar3 = (WasmBinaryReader *)(this->m_funcInfo->m_customReader).ptr;
  pWVar4 = pWVar3;
  if (pWVar3 == (WasmBinaryReader *)0x0) {
    pWVar4 = (this->m_module->m_reader).ptr;
  }
  if (pWVar3 == (WasmBinaryReader *)0x0) {
    pWVar3 = (this->m_module->m_reader).ptr;
  }
  if ((pWVar4->super_WasmReaderBase).m_currentNode.field_1.mem.alignment < 0x11) {
    uVar1 = (pWVar3->super_WasmReaderBase).m_currentNode.field_1.brTable.numTargets;
    EVar5.super_EmitInfoBase.location = 0xffffffff;
    EVar5.type = Void;
    local_50.super_EmitInfoBase.location = 0xffffffff;
    local_50.type = Void;
    if (isStore) {
      local_50 = PopEvalStack(this,type,L"Invalid type for store op");
      rhsInfo = PopEvalStack(this,FirstLocalType,L"Index expression must be of type i32");
      (*this->m_writer->_vptr_IWasmByteCodeWriter[0x16])
                (this->m_writer,(ulong)op,(ulong)local_50 & 0xffffffff,(ulong)rhsInfo & 0xffffffff,
                 (ulong)dataWidth,(ulong)viewType,uVar1);
      ReleaseLocation(this,&local_50);
      ReleaseLocation(this,&rhsInfo);
    }
    else {
      rhsInfo = PopEvalStack(this,FirstLocalType,L"Index expression must be of type i32");
      this_00 = GetRegisterSpace(this,type);
      EVar2.location = WAsmJs::RegisterSpace::AcquireTmpRegister(this_00);
      (*this->m_writer->_vptr_IWasmByteCodeWriter[0x16])
                (this->m_writer,(ulong)op,(ulong)EVar2.location,(ulong)rhsInfo & 0xffffffff,
                 (ulong)dataWidth,(ulong)viewType,uVar1);
      ReleaseLocation(this,&rhsInfo);
      EVar5.type = type;
      EVar5.super_EmitInfoBase.location = EVar2.location;
    }
    return EVar5;
  }
  this_01 = (WasmCompilationException *)__cxa_allocate_exception(8);
  WasmCompilationException::WasmCompilationException
            (this_01,L"alignment must not be larger than natural");
  __cxa_throw(this_01,&WasmCompilationException::typeinfo,
              WasmCompilationException::~WasmCompilationException);
}

Assistant:

EmitInfo WasmBytecodeGenerator::EmitSimdMemAccess(Js::OpCodeAsmJs op, const WasmTypes::WasmType* signature, Js::ArrayBufferView::ViewType viewType, uint8 dataWidth, bool isStore)
{

    WasmTypes::WasmType type = signature[0];
    SetUsesMemory(0);

    const uint32 naturalAlignment = 16;
    const uint alignment = GetReader()->m_currentNode.mem.alignment;
    const uint offset = GetReader()->m_currentNode.mem.offset;

    if (alignment > naturalAlignment)
    {
        throw WasmCompilationException(_u("alignment must not be larger than natural"));
    }

    EmitInfo rhsInfo;
    if (isStore)
    {
        rhsInfo = PopEvalStack(type, _u("Invalid type for store op"));
    }
    EmitInfo exprInfo = PopEvalStack(WasmTypes::I32, _u("Index expression must be of type i32"));

    if (isStore)
    {
        m_writer->AsmSimdTypedArr(op, rhsInfo.location, exprInfo.location, dataWidth, viewType, offset);

        ReleaseLocation(&rhsInfo);
        ReleaseLocation(&exprInfo);

        return EmitInfo();
    }

    Js::RegSlot resultReg = GetRegisterSpace(type)->AcquireTmpRegister();
    m_writer->AsmSimdTypedArr(op, resultReg, exprInfo.location, dataWidth, viewType, offset);

    EmitInfo yieldInfo = EmitInfo(resultReg, type);
    ReleaseLocation(&exprInfo);

    return yieldInfo;
}